

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

DescriptorNames __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocatePlaceholderNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,string_view full_name,size_t name_size)

{
  _Storage<google::protobuf::internal::DescriptorNames,_true> _Var1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  initializer_list<unsigned_long> sizes;
  string_view name;
  optional<google::protobuf::internal::DescriptorNames> oVar2;
  size_t local_38;
  size_t local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  string_view local_18;
  
  local_28._M_str = full_name._M_str;
  local_30 = full_name._M_len;
  local_18 = AllocatePlaceholderNames::kNullChar;
  bytes._M_len = 2;
  bytes._M_array = &local_28;
  sizes._M_len = 2;
  sizes._M_array = &local_38;
  local_38 = name_size;
  local_28._M_len = local_30;
  oVar2 = CreateDescriptorNames(this,bytes,sizes);
  _Var1 = oVar2.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
          _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
          _M_payload;
  if (((undefined1  [16])
       oVar2.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
      (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    name._M_str = "unknown";
    name._M_len = 7;
    oVar2 = AllocateEntityNames(this,(string_view)(ZEXT816(0x36e79f) << 0x40),name);
    _Var1 = oVar2.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
            _M_payload;
    if (((undefined1  [16])
         oVar2.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
  }
  return (DescriptorNames)_Var1;
}

Assistant:

internal::DescriptorNames AllocatePlaceholderNames(
      absl::string_view full_name, size_t name_size) {
    static constexpr absl::string_view kNullChar("\0", 1);
    auto out = CreateDescriptorNames({full_name, kNullChar},
                                     {name_size, full_name.size()});
    if (out.has_value()) return *out;
    // Return any valid name for the caller to use and keep going.
    return AllocateEntityNames("", "unknown").value();
  }